

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

bool __thiscall HModel::workArrays_OK(HModel *this,int phase)

{
  double dVar1;
  long lVar2;
  long lVar3;
  char *__format;
  double dVar4;
  
  if (phase != 1) {
    lVar2 = (long)this->numCol;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if (-1e+200 < dVar1) {
          dVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3];
          if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) goto LAB_0012b39c;
        }
        dVar1 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if (dVar1 < 1e+200) {
          dVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3];
          if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
            __format = "For col %d, workUpper should be %g but is %g\n";
            goto LAB_0012b3b5;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    if (0 < (long)this->numRow) {
      lVar3 = 0;
      do {
        dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2 + lVar3];
        if (-1e+200 < dVar1) {
          dVar4 = -(this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3];
          if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
            __format = "For row %d, workLower should be %g but is %g\n";
            goto LAB_0012b3b5;
          }
        }
        dVar1 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2 + lVar3];
        if (dVar1 < 1e+200) {
          dVar4 = -(this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3];
          if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
            __format = "For row %d, workUpper should be %g but is %g\n";
            goto LAB_0012b3b5;
          }
        }
        lVar3 = lVar3 + 1;
      } while (this->numRow != lVar3);
    }
  }
  if (0 < (long)this->numTot) {
    lVar2 = 0;
    do {
      dVar1 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar2];
      dVar4 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar2] -
              (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar2];
      if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
        printf("For variable %d, workRange should be %g = %g - %g but is %g\n");
        return false;
      }
      lVar2 = lVar2 + 1;
    } while (this->numTot != lVar2);
  }
  if (this->problemPerturbed == 0) {
    lVar2 = (long)this->numCol;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        dVar4 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3] * (double)this->objSense;
        dVar1 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
          dVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3];
LAB_0012b39c:
          __format = "For col %d, workLower should be %g but is %g\n";
LAB_0012b3b5:
          printf(__format,dVar4);
          return false;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    if (0 < (long)this->numRow) {
      lVar3 = 0;
      do {
        dVar1 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2 + lVar3];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          printf("For row %d, workCost should be zero but is %g\n");
          return false;
        }
        lVar3 = lVar3 + 1;
      } while (this->numRow != lVar3);
    }
  }
  return true;
}

Assistant:

bool HModel::workArrays_OK(int phase) {
  //  printf("Called workArrays_OK(%d)\n", phase);cout << flush;
  bool ok = true;
  //Don't check phase 1 bounds: these will have been set by solve() so can be trusted
  if (phase != 1) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == colLower[col];
	if (!ok) {
	  printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == colUpper[col];
	if (!ok) {
	  printf("For col %d, workUpper should be %g but is %g\n", col, colUpper[col], workUpper[var]);
	  return ok;
	}
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == -rowUpper[row];
	if (!ok) {
	  printf("For row %d, workLower should be %g but is %g\n", row, -rowUpper[row], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == -rowLower[row];
	if (!ok) {
	  printf("For row %d, workUpper should be %g but is %g\n", row, -rowLower[row], workUpper[var]);
	  return ok;
	}
      }
    }
  }
  for (int var = 0; var < numTot; ++var) {
    ok = workRange[var] == (workUpper[var] - workLower[var]);
    if (!ok) {
      printf("For variable %d, workRange should be %g = %g - %g but is %g\n",
	     var, workUpper[var] - workLower[var], workUpper[var], workLower[var], workRange[var]);
      return ok;
    }
  }
  //Don't check perturbed costs: these will have been set by solve() so can be trusted
  if (!problemPerturbed) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      double sense_col_cost = objSense*colCost[col];
      ok = workCost[var] == sense_col_cost;
      if (!ok) {
	printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workCost[var]);
	return ok;
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      ok = workCost[var] == 0.;
      if (!ok) {
	printf("For row %d, workCost should be zero but is %g\n", row, workCost[var]);
	return ok;
      }
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}